

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

void __thiscall webrtc::Matrix<std::complex<float>_>::Resize(Matrix<std::complex<float>_> *this)

{
  reference pvVar1;
  reference ppcVar2;
  ulong local_20;
  size_t i;
  size_t size;
  Matrix<std::complex<float>_> *this_local;
  
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            (&this->data_,this->num_rows_ * this->num_columns_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::resize
            (&this->elements_,this->num_rows_);
  for (local_20 = 0; local_20 < this->num_rows_; local_20 = local_20 + 1) {
    pvVar1 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                       (&this->data_,local_20 * this->num_columns_);
    ppcVar2 = std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::operator[]
                        (&this->elements_,local_20);
    *ppcVar2 = pvVar1;
  }
  return;
}

Assistant:

void Resize() {
    size_t size = num_rows_ * num_columns_;
    data_.resize(size);
    elements_.resize(num_rows_);

    for (size_t i = 0; i < num_rows_; ++i) {
      elements_[i] = &data_[i * num_columns_];
    }
  }